

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cpp
# Opt level: O1

string * __thiscall
Symbol_Table::get_type(string *__return_storage_ptr__,Symbol_Table *this,string *identifier)

{
  mapped_type pIVar1;
  pointer pcVar2;
  const_iterator cVar3;
  mapped_type *ppIVar4;
  Symbol_Table *this_00;
  
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
                  *)this,identifier);
  this_00 = (Symbol_Table *)&this->subroutine_scope;
  if ((_Rb_tree_header *)cVar3._M_node != &(this->class_scope)._M_t._M_impl.super__Rb_tree_header) {
    this_00 = this;
  }
  ppIVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IdentifierData_*>_>_>
            ::operator[](&this_00->class_scope,identifier);
  pIVar1 = *ppIVar4;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pIVar1->type)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pIVar1->type)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Symbol_Table::get_type(const std::string& identifier) {
    if (class_scope.count(identifier) > 0) {
        return class_scope[identifier]->type;
    }
    return subroutine_scope[identifier]->type;
}